

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetLocation(TgTypeParser *this,ptree *data)

{
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  type_conflict3 tVar1;
  Ptr PVar2;
  float local_44;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  std::make_shared<TgBot::Location>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_40,"longitude",0x2e);
  local_44 = 0.0;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<float>(in_RDX,&local_40,&local_44);
  **(type_conflict3 **)this = tVar1;
  std::__cxx11::string::~string((string *)&local_40);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_40,"latitude",0x2e);
  local_44 = 0.0;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<float>(in_RDX,&local_40,&local_44);
  *(type_conflict3 *)(*(long *)this + 4) = tVar1;
  std::__cxx11::string::~string((string *)&local_40);
  PVar2.super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<TgBot::Location,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Location::Ptr TgTypeParser::parseJsonAndGetLocation(const ptree& data) const {
    auto result(make_shared<Location>());
    result->longitude = data.get<float>("longitude", 0);
    result->latitude = data.get<float>("latitude", 0);
    return result;
}